

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O3

uint8_t __thiscall AmpIO::GetNegativeLimitSwitches(AmpIO *this)

{
  quadlet_t qVar1;
  uint32_t uVar2;
  byte bVar3;
  
  qVar1 = this->ReadBuffer[2];
  uVar2 = BoardIO::GetHardwareVersion((BoardIO *)this);
  bVar3 = (byte)(qVar1 >> 8);
  if (uVar2 == 0x44514c41) {
    bVar3 = bVar3 & 0xf | (byte)(this->ReadBuffer[2] >> 0x14) & 0xf0;
  }
  else {
    bVar3 = bVar3 & 0xf;
  }
  return bVar3;
}

Assistant:

uint8_t AmpIO::GetNegativeLimitSwitches(void) const
{
    uint8_t neglim = static_cast<uint8_t>((this->GetDigitalInput()&0x00000f00)>>8);
    if (GetHardwareVersion() == DQLA_String) {
        neglim |= static_cast<uint8_t>((this->GetDigitalInput()&0x0f000000)>>20);
    }
    return neglim;
}